

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O2

string_view helics::fileops::removeSpaceAndComment(string_view jsonString)

{
  size_type sVar1;
  char *in_RCX;
  string_view sVar2;
  string_view trimCharacters;
  string_view trimCharacters_00;
  string_view jsonString_local;
  
  jsonString_local._M_str = jsonString._M_str;
  jsonString_local._M_len = jsonString._M_len;
  while( true ) {
    trimCharacters._M_str = in_RCX;
    trimCharacters._M_len = (size_t)" \t\n\r";
    gmlc::utilities::string_viewOps::trimString
              ((string_viewOps *)&jsonString_local,(string_view *)0x4,trimCharacters);
    if (((jsonString_local._M_len < 3) || (*jsonString_local._M_str != '/')) ||
       (jsonString_local._M_str[1] != '/')) break;
    sVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&jsonString_local,'\n',0)
    ;
    if (sVar1 == 0xffffffffffffffff) {
      jsonString_local._M_len = 0;
      jsonString_local._M_str = (char *)0x0;
      goto LAB_003172fd;
    }
    jsonString_local._M_str = jsonString_local._M_str + sVar1 + 1;
    jsonString_local._M_len = jsonString_local._M_len - (sVar1 + 1);
  }
  trimCharacters_00._M_str = in_RCX;
  trimCharacters_00._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&jsonString_local,(string_view *)0x4,trimCharacters_00);
LAB_003172fd:
  sVar2._M_str = jsonString_local._M_str;
  sVar2._M_len = jsonString_local._M_len;
  return sVar2;
}

Assistant:

static std::string_view removeSpaceAndComment(std::string_view jsonString)
{
    gmlc::utilities::string_viewOps::trimString(jsonString);
    while (jsonString.size() > 2) {
        if (jsonString[0] == '/' && jsonString[1] == '/') {
            auto nextNewLine = jsonString.find_first_of('\n');
            if (nextNewLine == std::string_view::npos) {
                return {};
            }
            jsonString.remove_prefix(nextNewLine + 1);
            gmlc::utilities::string_viewOps::trimString(jsonString);
        } else {
            break;
        }
    }
    gmlc::utilities::string_viewOps::trimString(jsonString);
    return jsonString;
}